

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void prvTidyPPrintXMLTree(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  int iVar1;
  Bool BVar2;
  Node *node_00;
  uint indent_00;
  uint indent_01;
  uint extraout_EDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  Node *pNVar4;
  bool bVar5;
  int local_34;
  undefined8 extraout_RDX;
  
  if (node == (Node *)0x0) {
    return;
  }
  iVar1 = *(int *)((doc->config).value + 0x61);
  if (doc->progressCallback != (TidyPPProgress)0x0) {
    (*doc->progressCallback)((TidyDoc)doc,node->line,node->column,(doc->pprint).line + 1);
  }
  switch(node->type) {
  case RootNode:
    for (pNVar4 = node->content; pNVar4 != (Node *)0x0; pNVar4 = pNVar4->next) {
      prvTidyPPrintXMLTree(doc,mode,indent,pNVar4);
    }
    return;
  case DocTypeTag:
    PPrintDocType(doc,indent,node);
    return;
  case CommentTag:
    PCondFlushLineSmart(doc,indent);
    PPrintComment(doc,indent,node);
    return;
  case ProcInsTag:
    PPrintPI(doc,indent,node);
    return;
  case TextNode:
    PPrintText(doc,mode,indent,node);
    return;
  case CDATATag:
    PPrintCDATA(doc,indent,node);
    return;
  case SectionTag:
    PPrintSection(doc,indent,node);
    return;
  case AspTag:
    PPrintAsp(doc,indent,node);
    return;
  case JsteTag:
    PPrintJste(doc,indent,node);
    return;
  case PhpTag:
    PPrintPhp(doc,indent,node);
    return;
  case XmlDecl:
    PPrintXmlDecl(doc,indent,node);
    return;
  }
  BVar2 = prvTidynodeHasCM(node,1);
  if ((BVar2 != no) || ((node->type == StartEndTag && (iVar1 == 0)))) {
    PCondFlushLineSmart(doc,indent);
    PPrintTag(doc,mode,indent,node);
    return;
  }
  local_34 = *(int *)((doc->config).value + 0x26);
  pNVar4 = node->content;
  if (pNVar4 == (Node *)0x0) {
    bVar5 = true;
  }
  else {
    do {
      BVar2 = prvTidynodeIsText(pNVar4);
      bVar5 = BVar2 == no;
      if (!bVar5) {
        local_34 = 0;
        break;
      }
      pNVar4 = pNVar4->next;
    } while (pNVar4 != (Node *)0x0);
  }
  PCondFlushLineSmart(doc,indent);
  BVar2 = prvTidyXMLPreserveWhiteSpace(doc,node);
  indent_00 = local_34 + indent;
  if (BVar2 != no) {
    indent = 0;
    indent_00 = 0;
  }
  bVar5 = (bool)(BVar2 != no | bVar5);
  node_00 = node;
  PPrintTag(doc,mode,indent,node);
  indent_01 = (uint)extraout_RDX;
  pNVar4 = node->content;
  uVar3 = extraout_RDX;
  if (bVar5) {
    if (pNVar4 == (Node *)0x0) goto LAB_0014a0c4;
    prvTidyPFlushLineSmart(doc,indent_00);
    pNVar4 = node->content;
    uVar3 = extraout_RDX_00;
  }
  for (; indent_01 = (uint)uVar3, pNVar4 != (Node *)0x0; pNVar4 = pNVar4->next) {
    node_00 = pNVar4;
    prvTidyPPrintXMLTree(doc,mode,indent_00,pNVar4);
    uVar3 = extraout_RDX_01;
  }
  if ((bVar5) && (node->content != (Node *)0x0)) {
    PCondFlushLineSmart(doc,indent);
    indent_01 = extraout_EDX;
  }
LAB_0014a0c4:
  PPrintEndTag(doc,(uint)node->element,indent_01,node_00);
  return;
}

Assistant:

void TY_(PPrintXMLTree)( TidyDocImpl* doc, uint mode, uint indent, Node *node )
{
    Bool xhtmlOut = cfgBool( doc, TidyXhtmlOut );
    if (node == NULL)
        return;

    if (doc->progressCallback)
    {
        doc->progressCallback( tidyImplToDoc(doc), node->line, node->column, doc->pprint.line + 1 );
    }
    
    if ( node->type == TextNode)
    {
        PPrintText( doc, mode, indent, node );
    }
    else if ( node->type == CommentTag )
    {
        PCondFlushLineSmart( doc, indent );
        PPrintComment( doc, indent, node);
        /* PCondFlushLine( doc, 0 ); */
    }
    else if ( node->type == RootNode )
    {
        Node *content;
        for ( content = node->content;
              content != NULL;
              content = content->next )
           TY_(PPrintXMLTree)( doc, mode, indent, content );
    }
    else if ( node->type == DocTypeTag )
        PPrintDocType( doc, indent, node );
    else if ( node->type == ProcInsTag )
        PPrintPI( doc, indent, node );
    else if ( node->type == XmlDecl )
        PPrintXmlDecl( doc, indent, node );
    else if ( node->type == CDATATag )
        PPrintCDATA( doc, indent, node );
    else if ( node->type == SectionTag )
        PPrintSection( doc, indent, node );
    else if ( node->type == AspTag )
        PPrintAsp( doc, indent, node );
    else if ( node->type == JsteTag)
        PPrintJste( doc, indent, node );
    else if ( node->type == PhpTag)
        PPrintPhp( doc, indent, node );
    else if ( TY_(nodeHasCM)(node, CM_EMPTY) ||
              (node->type == StartEndTag && !xhtmlOut) )
    {
        PCondFlushLineSmart( doc, indent );
        PPrintTag( doc, mode, indent, node );
        /* TY_(PFlushLine)( doc, indent ); */
    }
    else /* some kind of container element */
    {
        uint spaces = cfg( doc, TidyIndentSpaces );
        Node *content;
        Bool mixed = no;
        uint cindent;

        for ( content = node->content; content; content = content->next )
        {
            if ( TY_(nodeIsText)(content) )
            {
                mixed = yes;
                break;
            }
        }

        PCondFlushLineSmart( doc, indent );

        if ( TY_(XMLPreserveWhiteSpace)(doc, node) )
        {
            indent = 0;
            mixed = no;
            cindent = 0;
        }
        else if (mixed)
            cindent = indent;
        else
            cindent = indent + spaces;

        PPrintTag( doc, mode, indent, node );
        if ( !mixed && node->content )
            TY_(PFlushLineSmart)( doc, cindent );
 
        for ( content = node->content; content; content = content->next )
            TY_(PPrintXMLTree)( doc, mode, cindent, content );

        if ( !mixed && node->content )
            PCondFlushLineSmart( doc, indent );

        PPrintEndTag( doc, mode, indent, node );
        /* PCondFlushLine( doc, indent ); */
    }
}